

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O1

void __thiscall minibag::BZ2Stream::startRead(BZ2Stream *this)

{
  int verbosity;
  int nUnused;
  FILE *f;
  char *unused;
  BZFILE *b;
  runtime_error *this_00;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  f = Stream::getFilePointer(&this->super_Stream);
  verbosity = this->verbosity_;
  unused = Stream::getUnused(&this->super_Stream);
  nUnused = Stream::getUnusedLength(&this->super_Stream);
  b = BZ2_bzReadOpen(&this->bzerror_,f,verbosity,0,unused,nUnused);
  this->bzfile_ = b;
  if (this->bzerror_ == 0) {
    Stream::clearUnused(&this->super_Stream);
    return;
  }
  BZ2_bzReadClose(&this->bzerror_,b);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Error opening file for reading compressed stream","");
  std::runtime_error::runtime_error(this_00,(string *)local_48);
  *(undefined ***)this_00 = &PTR__runtime_error_001506a0;
  __cxa_throw(this_00,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BZ2Stream::startRead() {
    bzfile_ = BZ2_bzReadOpen(&bzerror_, getFilePointer(), verbosity_, 0, getUnused(), getUnusedLength());

    switch (bzerror_) {
        case BZ_OK: break;
        default: {
            BZ2_bzReadClose(&bzerror_, bzfile_);
            throw BagException("Error opening file for reading compressed stream");
        }
    }

    clearUnused();
}